

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O0

int testFileWriterTestsWriteDataWithOffset(void)

{
  allocator<unsigned_char> *this;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  bool bVar1;
  string *psVar2;
  size_type __n;
  iterator ptVar3;
  iterator ptVar4;
  iterator ptVar5;
  iterator ptVar6;
  ostream *poVar7;
  SpanSize<18446744073709551615UL> extraout_RDX;
  SpanSize<18446744073709551615UL> in_R8;
  Span<unsigned_char,_18446744073709551615UL> SVar8;
  Span<unsigned_char,_18446744073709551615UL> SVar9;
  Span<unsigned_char,_18446744073709551615UL> data;
  uchar local_334 [4];
  iterator local_330;
  undefined8 local_328;
  int local_31c;
  pointer local_318;
  pointer ptStack_310;
  undefined1 auStack_308 [8];
  Span<unsigned_char,_18446744073709551615UL> outputSpan;
  undefined1 local_2f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  Span<unsigned_char,_18446744073709551615UL> local_2c0;
  Span<const_unsigned_char,_18446744073709551615UL> local_2b0;
  undefined1 local_2a0 [8];
  FileWriter writer;
  Span<unsigned_char,_18446744073709551615UL> expectedSpan;
  allocator<unsigned_char> local_6d;
  uchar local_6c [4];
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  uint64_t offset;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)&offset);
  expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x40;
  builtin_memcpy(local_6c,"\n\x14\x1e(",4);
  local_68 = local_6c;
  local_60 = 4;
  std::allocator<unsigned_char>::allocator(&local_6d);
  __l_00._M_len = local_60;
  __l_00._M_array = local_68;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__l_00,&local_6d);
  std::allocator<unsigned_char>::~allocator(&local_6d);
  SVar8 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  writer._520_8_ = SVar8.m_ptr;
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&offset);
  MILBlob::Blob::FileWriter::FileWriter((FileWriter *)local_2a0,psVar2,true);
  output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)writer._520_8_;
  SVar9.m_size.m_size = extraout_RDX.m_size;
  SVar9.m_ptr = (pointer)SVar8.m_size.m_size.m_size;
  local_2c0 = MILBlob::Util::SpanCast<unsigned_char,unsigned_char>((Util *)writer._520_8_,SVar9);
  MILBlob::Util::Span<const_unsigned_char,_18446744073709551615UL>::Span<unsigned_char,_0>
            (&local_2b0,&local_2c0);
  MILBlob::Blob::FileWriter::WriteData
            ((FileWriter *)local_2a0,local_2b0,
             (uint64_t)
             expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  MILBlob::Blob::FileWriter::~FileWriter((FileWriter *)local_2a0);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  this = (allocator<unsigned_char> *)((long)&outputSpan.m_size.m_size + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0,__n,this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&outputSpan.m_size.m_size + 7));
  SVar9 = MILBlob::Util::MakeSpan<unsigned_char,_std::vector,_std::allocator<unsigned_char>_>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0);
  outputSpan.m_ptr = (pointer)SVar9.m_size.m_size;
  auStack_308 = (undefined1  [8])SVar9.m_ptr;
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&offset);
  local_318 = (pointer)auStack_308;
  ptStack_310 = outputSpan.m_ptr;
  SVar8.m_size.m_size = in_R8.m_size;
  SVar8.m_ptr = outputSpan.m_ptr;
  MILBlob::TestUtil::ReadBlobFile<unsigned_char>
            ((TestUtil *)psVar2,
             (string *)
             expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(uint64_t)auStack_308,SVar8);
  ptVar3 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                     ((Span<unsigned_char,_18446744073709551615UL> *)&writer.field_0x208);
  ptVar4 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                     ((Span<unsigned_char,_18446744073709551615UL> *)&writer.field_0x208);
  ptVar5 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                     ((Span<unsigned_char,_18446744073709551615UL> *)auStack_308);
  ptVar6 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                     ((Span<unsigned_char,_18446744073709551615UL> *)auStack_308);
  bVar1 = std::equal<unsigned_char*,unsigned_char*>(ptVar3,ptVar4,ptVar5,ptVar6);
  if (bVar1) {
    local_334[0] = '\0';
    local_334[1] = 0;
    local_334[2] = 0;
    local_334[3] = 0;
    local_330 = local_334;
    local_328 = 4;
    __l._M_len = 4;
    __l._M_array = local_330;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,__l);
    psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                       ((AutoDeleteTempFile *)&offset);
    data.m_size.m_size = in_R8.m_size;
    data.m_ptr = outputSpan.m_ptr;
    MILBlob::TestUtil::ReadBlobFile<unsigned_char>
              ((TestUtil *)psVar2,(string *)0x0,(uint64_t)auStack_308,data);
    ptVar3 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                       ((Span<unsigned_char,_18446744073709551615UL> *)&writer.field_0x208);
    ptVar4 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                       ((Span<unsigned_char,_18446744073709551615UL> *)&writer.field_0x208);
    ptVar5 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::begin
                       ((Span<unsigned_char,_18446744073709551615UL> *)auStack_308);
    ptVar6 = MILBlob::Util::Span<unsigned_char,_18446744073709551615UL>::end
                       ((Span<unsigned_char,_18446744073709551615UL> *)auStack_308);
    bVar1 = std::equal<unsigned_char*,unsigned_char*>(ptVar3,ptVar4,ptVar5,ptVar6);
    if (bVar1) {
      local_31c = 0;
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x79);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,
                               "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                              );
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      tempfile._36_4_ = 1;
      local_31c = 1;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x74);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,
                             "std::equal(expectedSpan.begin(), expectedSpan.end(), outputSpan.begin(), outputSpan.end())"
                            );
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    tempfile._36_4_ = 1;
    local_31c = 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  if (local_31c == 0) {
    tempfile._36_4_ = 0;
    local_31c = 1;
  }
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&offset);
  return tempfile._36_4_;
}

Assistant:

int testFileWriterTestsWriteDataWithOffset()
{
    AutoDeleteTempFile tempfile;
    // Writing to empty file
    {
        uint64_t offset = 64;
        std::vector<uint8_t> expected{10, 20, 30, 40};
        auto expectedSpan = Util::MakeSpan(expected);
        {
            FileWriter writer(tempfile.GetFilename(), /* truncateFile */ true);
            writer.WriteData(Util::SpanCast<uint8_t>(expectedSpan), offset);
        }
        std::vector<uint8_t> output(expected.size());
        auto outputSpan = Util::MakeSpan(output);
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), offset, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);

        // Writer writes 0s if offset is out of current file boundry
        expected = {0, 0, 0, 0};
        TestUtil::ReadBlobFile<uint8_t>(tempfile.GetFilename(), 0, outputSpan);
        ML_ASSERT_SPAN_EQ(expectedSpan, outputSpan);
    }

    return 0;
}